

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O3

float __thiscall
tcu::TextureCubeView::sampleCompare
          (TextureCubeView *this,Sampler *sampler,float ref,float s,float t,float r,float lod)

{
  int *piVar1;
  FilterMode FVar2;
  TextureFormat TVar3;
  void *pvVar4;
  void *pvVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  ConstPixelBufferAccess *pCVar14;
  ConstPixelBufferAccess **ppCVar15;
  CubeFace baseFace;
  float t_00;
  float fVar16;
  float fVar17;
  float fVar18;
  CubeFaceFloatCoords CVar19;
  ConstPixelBufferAccess faceAccesses [6];
  ulong local_220;
  undefined1 local_218 [32];
  void *apvStack_1f8 [2];
  undefined4 uStack_1e8;
  int aiStack_1e4 [45];
  TextureFormat TStack_130;
  undefined1 local_128 [16];
  undefined1 auStack_118 [8];
  undefined8 auStack_110 [28];
  
  local_218._4_4_ = t;
  local_218._0_4_ = s;
  local_218._8_4_ = r;
  CVar19 = getCubeFaceCoords((Vec3 *)local_218);
  t_00 = CVar19.t;
  uVar9 = CVar19._0_8_;
  fVar16 = CVar19.s;
  baseFace = CVar19.face;
  if (sampler->seamlessCubeMap != true) {
    local_218._0_4_ = R;
    local_218._4_4_ = SNORM_INT8;
    local_218._8_8_ = (ulong)(uint)local_218._12_4_ << 0x20;
    fVar16 = sampleLevelArray2DCompare
                       (this->m_levels[uVar9 & 0xffffffff],this->m_numLevels,sampler,ref,fVar16,t_00
                        ,lod,(IVec3 *)local_218);
    return fVar16;
  }
  FVar2 = (&sampler->minFilter)[lod <= sampler->lodThreshold];
  if (LINEAR_MIPMAP_LINEAR < FVar2) {
    return 0.0;
  }
  ppCVar15 = this->m_levels;
  switch(FVar2) {
  case NEAREST:
    pCVar14 = ppCVar15[uVar9 & 0xffffffff];
    local_218._8_4_ = sampler->wrapR;
    local_218._12_4_ = sampler->minFilter;
    local_218._16_4_ = sampler->magFilter;
    local_218._20_4_ = sampler->lodThreshold;
    local_218._24_8_ = *(undefined8 *)&sampler->normalizedCoords;
    apvStack_1f8[0] = *(void **)&sampler->compareChannel;
    uVar6 = *(undefined8 *)((long)&(sampler->borderColor).v + 4);
    aiStack_1e4._0_8_ = *(undefined8 *)&sampler->seamlessCubeMap;
    uStack_1e8 = (undefined4)((ulong)*(undefined8 *)((long)&(sampler->borderColor).v + 8) >> 0x20);
    apvStack_1f8[1]._0_4_ = (undefined4)uVar6;
    apvStack_1f8[1]._4_4_ = (undefined4)((ulong)uVar6 >> 0x20);
    break;
  case LINEAR:
    lVar11 = 8;
    do {
      *(undefined8 *)(local_218 + lVar11 + -8) = 0x2600000015;
      *(undefined8 *)(local_218 + lVar11) = 0;
      *(undefined8 *)(local_218 + lVar11 + 8) = 0;
      *(undefined8 *)(local_218 + lVar11 + 0x10) = 0;
      *(undefined8 *)(local_218 + lVar11 + 0x18) = 0;
      lVar11 = lVar11 + 0x28;
    } while (lVar11 != 0xf8);
    lVar11 = 0;
    do {
      pCVar14 = *ppCVar15;
      apvStack_1f8[lVar11] = pCVar14->m_data;
      TVar3 = pCVar14->m_format;
      pvVar4 = *(void **)(pCVar14->m_size).m_data;
      pvVar5 = *(void **)((pCVar14->m_pitch).m_data + 1);
      apvStack_1f8[lVar11 + -2] = *(void **)((pCVar14->m_size).m_data + 2);
      apvStack_1f8[lVar11 + -1] = pvVar5;
      *(TextureFormat *)(local_218 + lVar11 * 8) = TVar3;
      apvStack_1f8[lVar11 + -3] = pvVar4;
      lVar11 = lVar11 + 5;
      ppCVar15 = ppCVar15 + 1;
    } while (lVar11 != 0x1e);
LAB_00a94a71:
    fVar16 = sampleCubeSeamlessLinearCompare
                       ((ConstPixelBufferAccess (*) [6])local_218,baseFace,sampler,ref,fVar16,t_00);
    return fVar16;
  default:
    iVar12 = this->m_numLevels + -1;
    fVar17 = ceilf(lod + 0.5);
    iVar13 = (int)fVar17 + -1;
    if (iVar13 < iVar12) {
      iVar12 = iVar13;
    }
    iVar10 = 0;
    if (-1 < iVar13) {
      iVar10 = iVar12;
    }
    if (FVar2 == LINEAR_MIPMAP_NEAREST) {
      lVar11 = 8;
      do {
        *(undefined8 *)(local_218 + lVar11 + -8) = 0x2600000015;
        *(undefined8 *)(local_218 + lVar11) = 0;
        *(undefined8 *)(local_218 + lVar11 + 8) = 0;
        *(undefined8 *)(local_218 + lVar11 + 0x10) = 0;
        *(undefined8 *)(local_218 + lVar11 + 0x18) = 0;
        lVar11 = lVar11 + 0x28;
      } while (lVar11 != 0xf8);
      lVar11 = 0;
      do {
        pCVar14 = *ppCVar15;
        apvStack_1f8[lVar11] = pCVar14[iVar10].m_data;
        TVar3 = pCVar14[iVar10].m_format;
        pvVar4 = *(void **)pCVar14[iVar10].m_size.m_data;
        piVar1 = pCVar14[iVar10].m_size.m_data + 2;
        pvVar5 = *(void **)(piVar1 + 2);
        apvStack_1f8[lVar11 + -2] = *(void **)piVar1;
        apvStack_1f8[lVar11 + -1] = pvVar5;
        *(TextureFormat *)(local_218 + lVar11 * 8) = TVar3;
        apvStack_1f8[lVar11 + -3] = pvVar4;
        lVar11 = lVar11 + 5;
        ppCVar15 = ppCVar15 + 1;
      } while (lVar11 != 0x1e);
      goto LAB_00a94a71;
    }
    pCVar14 = ppCVar15[uVar9 & 0xffffffff] + iVar10;
    local_218._8_4_ = sampler->wrapR;
    local_218._12_4_ = sampler->minFilter;
    local_218._16_4_ = sampler->magFilter;
    local_218._20_4_ = sampler->lodThreshold;
    local_218._24_8_ = *(undefined8 *)&sampler->normalizedCoords;
    apvStack_1f8[0] = *(void **)&sampler->compareChannel;
    uVar6 = *(undefined8 *)((long)&(sampler->borderColor).v + 4);
    aiStack_1e4._0_8_ = *(undefined8 *)&sampler->seamlessCubeMap;
    uStack_1e8 = (undefined4)((ulong)*(undefined8 *)((long)&(sampler->borderColor).v + 8) >> 0x20);
    apvStack_1f8[1]._0_4_ = (undefined4)uVar6;
    apvStack_1f8[1]._4_4_ = (undefined4)((ulong)uVar6 >> 0x20);
    break;
  case NEAREST_MIPMAP_LINEAR:
  case LINEAR_MIPMAP_LINEAR:
    iVar13 = this->m_numLevels + -1;
    fVar17 = floorf(lod);
    iVar10 = (int)fVar17;
    iVar12 = iVar13;
    if (iVar10 < iVar13) {
      iVar12 = iVar10;
    }
    if (iVar10 < 0) {
      iVar12 = 0;
    }
    if (iVar12 + 1 <= iVar13) {
      iVar13 = iVar12 + 1;
    }
    if (FVar2 == LINEAR_MIPMAP_LINEAR) {
      lVar11 = 8;
      do {
        *(undefined8 *)(local_218 + lVar11 + -8) = 0x2600000015;
        *(undefined8 *)(local_218 + lVar11) = 0;
        *(undefined8 *)(local_218 + lVar11 + 8) = 0;
        *(undefined8 *)(local_218 + lVar11 + 0x10) = 0;
        *(undefined8 *)(local_218 + lVar11 + 0x18) = 0;
        lVar11 = lVar11 + 0x28;
      } while (lVar11 != 0xf8);
      lVar11 = 8;
      do {
        *(undefined8 *)((long)&TStack_130.order + lVar11) = 0x2600000015;
        *(undefined8 *)(local_128 + lVar11) = 0;
        *(undefined8 *)(local_128 + lVar11 + 8) = 0;
        *(undefined8 *)(local_128 + lVar11 + 0x10) = 0;
        *(undefined8 *)(local_128 + lVar11 + 0x18) = 0;
        lVar11 = lVar11 + 0x28;
      } while (lVar11 != 0xf8);
      lVar11 = 0;
      do {
        pCVar14 = *ppCVar15;
        apvStack_1f8[lVar11] = pCVar14[iVar12].m_data;
        TVar3 = pCVar14[iVar12].m_format;
        pvVar4 = *(void **)pCVar14[iVar12].m_size.m_data;
        piVar1 = pCVar14[iVar12].m_size.m_data + 2;
        pvVar5 = *(void **)(piVar1 + 2);
        apvStack_1f8[lVar11 + -2] = *(void **)piVar1;
        apvStack_1f8[lVar11 + -1] = pvVar5;
        *(TextureFormat *)(local_218 + lVar11 * 8) = TVar3;
        apvStack_1f8[lVar11 + -3] = pvVar4;
        uVar6 = *(undefined8 *)pCVar14[iVar13].m_size.m_data;
        piVar1 = pCVar14[iVar13].m_size.m_data + 2;
        uVar7 = *(undefined8 *)piVar1;
        uVar8 = *(undefined8 *)(piVar1 + 2);
        *(TextureFormat *)(local_128 + (lVar11 * 2 + -2) * 4 + 8) = pCVar14[iVar13].m_format;
        *(undefined8 *)(local_128 + lVar11 * 8 + 8) = uVar6;
        *(undefined8 *)(local_128 + (lVar11 * 2 + -1) * 4 + 0x14) = uVar7;
        *(undefined8 *)(local_128 + (lVar11 * 2 + 1) * 4 + 0x14) = uVar8;
        *(void **)(local_128 + lVar11 * 8 + 0x20) = pCVar14[iVar13].m_data;
        lVar11 = lVar11 + 5;
        ppCVar15 = ppCVar15 + 1;
      } while (lVar11 != 0x1e);
      fVar18 = sampleCubeSeamlessLinearCompare
                         ((ConstPixelBufferAccess (*) [6])local_218,baseFace,sampler,ref,fVar16,t_00
                         );
      local_220 = CONCAT44(local_220._4_4_,fVar18);
      fVar16 = sampleCubeSeamlessLinearCompare
                         ((ConstPixelBufferAccess (*) [6])local_128,baseFace,sampler,ref,fVar16,t_00
                         );
    }
    else {
      local_220 = uVar9 & 0xffffffff;
      local_218._8_4_ = sampler->wrapR;
      local_218._12_4_ = sampler->minFilter;
      local_218._16_4_ = sampler->magFilter;
      local_218._20_4_ = sampler->lodThreshold;
      local_218._24_8_ = *(undefined8 *)&sampler->normalizedCoords;
      apvStack_1f8[0] = *(void **)&sampler->compareChannel;
      uVar6 = *(undefined8 *)((long)&(sampler->borderColor).v + 4);
      aiStack_1e4._0_8_ = *(undefined8 *)&sampler->seamlessCubeMap;
      uStack_1e8 = (undefined4)((ulong)*(undefined8 *)((long)&(sampler->borderColor).v + 8) >> 0x20)
      ;
      apvStack_1f8[1]._0_4_ = (undefined4)uVar6;
      apvStack_1f8[1]._4_4_ = (undefined4)((ulong)uVar6 >> 0x20);
      local_218._0_4_ = R;
      local_218._4_4_ = SNORM_INT8;
      local_128._0_4_ = R;
      local_128._4_4_ = SNORM_INT8;
      local_128._8_4_ = 0;
      fVar18 = ConstPixelBufferAccess::sample2DCompare
                         (ppCVar15[local_220] + iVar12,(Sampler *)local_218,NEAREST,ref,fVar16,t_00,
                          (IVec3 *)local_128);
      ppCVar15 = ppCVar15 + local_220;
      local_220 = CONCAT44(local_220._4_4_,fVar18);
      local_218._8_4_ = sampler->wrapR;
      local_218._12_4_ = sampler->minFilter;
      local_218._16_4_ = sampler->magFilter;
      local_218._20_4_ = sampler->lodThreshold;
      local_218._24_8_ = *(undefined8 *)&sampler->normalizedCoords;
      apvStack_1f8[0] = *(void **)&sampler->compareChannel;
      uVar6 = *(undefined8 *)((long)&(sampler->borderColor).v + 4);
      aiStack_1e4._0_8_ = *(undefined8 *)&sampler->seamlessCubeMap;
      uStack_1e8 = (undefined4)((ulong)*(undefined8 *)((long)&(sampler->borderColor).v + 8) >> 0x20)
      ;
      apvStack_1f8[1]._0_4_ = (undefined4)uVar6;
      apvStack_1f8[1]._4_4_ = (undefined4)((ulong)uVar6 >> 0x20);
      local_218._0_4_ = R;
      local_218._4_4_ = SNORM_INT8;
      local_128._0_4_ = R;
      local_128._4_4_ = SNORM_INT8;
      local_128._8_4_ = 0;
      fVar16 = ConstPixelBufferAccess::sample2DCompare
                         (*ppCVar15 + iVar13,(Sampler *)local_218,NEAREST,ref,fVar16,t_00,
                          (IVec3 *)local_128);
    }
    return fVar16 * (lod - fVar17) + (1.0 - (lod - fVar17)) * (float)local_220;
  }
  local_128._8_4_ = 0;
  local_128._0_4_ = R;
  local_128._4_4_ = SNORM_INT8;
  local_218._0_4_ = R;
  local_218._4_4_ = SNORM_INT8;
  fVar16 = ConstPixelBufferAccess::sample2DCompare
                     (pCVar14,(Sampler *)local_218,NEAREST,ref,fVar16,t_00,(IVec3 *)local_128);
  return fVar16;
}

Assistant:

float TextureCubeView::sampleCompare (const Sampler& sampler, float ref, float s, float t, float r, float lod) const
{
	DE_ASSERT(sampler.compare != Sampler::COMPAREMODE_NONE);

	// Computes (face, s, t).
	const CubeFaceFloatCoords coords = getCubeFaceCoords(Vec3(s, t, r));
	if (sampler.seamlessCubeMap)
		return sampleLevelArrayCubeSeamlessCompare(m_levels, m_numLevels, coords.face, sampler, ref, coords.s, coords.t, lod);
	else
		return sampleLevelArray2DCompare(m_levels[coords.face], m_numLevels, sampler, ref, coords.s, coords.t, lod, IVec3(0, 0, 0));
}